

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_soo<char_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,char **key)

{
  char *__s;
  bool bVar1;
  slot_type *arg;
  size_t sVar2;
  size_t sVar3;
  iterator iVar4;
  string_view v;
  EqualElement<const_char_*> local_30;
  
  if (*(ulong *)(this + 8) < 2) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::try_sample_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this);
    CommonFields::set_full_soo((CommonFields *)this);
    iVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)this);
  }
  else {
    local_30.rhs = key;
    local_30.eq = (key_equal *)this;
    arg = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this);
    bVar1 = DecomposeValue<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>::EqualElement<char_const*>,std::basic_string_view<char,std::char_traits<char>>&>
                      (&local_30,arg);
    if (bVar1) {
      iVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this);
      bVar1 = false;
      goto LAB_001b5605;
    }
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::resize_impl(this,3);
    __s = *key;
    sVar2 = strlen(__s);
    v._M_str = __s;
    v._M_len = sVar2;
    sVar3 = StringHash::operator()((StringHash *)this,v);
    sVar3 = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                      (sVar3,0x10,(CommonFields *)this);
    iVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this,sVar3);
  }
  bVar1 = true;
LAB_001b5605:
  __return_storage_ptr__->first = iVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }